

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screenshot.hpp
# Opt level: O0

void __thiscall
Outputs::Display::OpenGL::Screenshot::Screenshot
          (Screenshot *this,int aspect_width,int aspect_height)

{
  undefined1 *puVar1;
  Screenshot *pSVar2;
  size_t sVar3;
  uchar *puVar4;
  reference pvVar5;
  reference __src;
  undefined1 *puVar6;
  size_type sVar7;
  undefined1 auStack_98 [8];
  reference local_90;
  undefined1 *local_88;
  int local_7c;
  int local_78;
  int local_74;
  Screenshot *local_70;
  Screenshot *local_68;
  size_t local_60;
  unsigned_long __vla_expr0;
  long local_50;
  size_t flipped_y;
  size_t y;
  size_t line_size;
  int prior_alignment;
  undefined1 local_28 [8];
  GLint dimensions [4];
  int aspect_height_local;
  int aspect_width_local;
  Screenshot *this_local;
  
  local_70 = this;
  local_68 = this;
  dimensions[2] = aspect_height;
  dimensions[3] = aspect_width;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pixel_data);
  glGetIntegerv(0xba2,local_28);
  local_68->height = dimensions[1];
  local_68->width = (local_68->height * dimensions[3]) / dimensions[2];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_68->pixel_data,(long)(local_68->width * local_68->height * 4));
  glGetIntegerv(0xd05,&line_size);
  local_78 = local_68->width;
  local_74 = local_68->height;
  local_7c = dimensions[0] - local_78 >> 1;
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&local_68->pixel_data);
  glReadPixels(local_7c,0,local_78,local_74,0x1908,0x1401,puVar4);
  glPixelStorei(0xd05,(undefined4)line_size);
  y = (size_t)(local_68->width << 2);
  __vla_expr0 = (unsigned_long)auStack_98;
  for (flipped_y = 0; pSVar2 = local_68, flipped_y < (ulong)(long)local_68->height >> 1;
      flipped_y = flipped_y + 1) {
    local_50 = (long)(local_68->height + -1) - flipped_y;
    puVar6 = (undefined1 *)(__vla_expr0 + -(y + 0xf & 0xfffffffffffffff0));
    local_60 = y;
    sVar7 = local_50 * y;
    local_88 = puVar6;
    *(undefined8 *)(puVar6 + -8) = 0x9ce6b3;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pSVar2->pixel_data,sVar7);
    sVar3 = y;
    puVar1 = local_88;
    *(undefined8 *)(puVar6 + -8) = 0x9ce6c3;
    memcpy(puVar1,pvVar5,sVar3);
    pSVar2 = local_68;
    sVar7 = local_50 * y;
    *(undefined8 *)(puVar6 + -8) = 0x9ce6d5;
    local_90 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pSVar2->pixel_data,sVar7);
    pSVar2 = local_68;
    sVar7 = flipped_y * y;
    *(undefined8 *)(puVar6 + -8) = 0x9ce6ee;
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&pSVar2->pixel_data,sVar7);
    sVar3 = y;
    pvVar5 = local_90;
    *(undefined8 *)(puVar6 + -8) = 0x9ce701;
    memcpy(pvVar5,__src,sVar3);
    pSVar2 = local_68;
    sVar7 = flipped_y * y;
    *(undefined8 *)(puVar6 + -8) = 0x9ce713;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pSVar2->pixel_data,sVar7);
    sVar3 = y;
    puVar1 = local_88;
    *(undefined8 *)(puVar6 + -8) = 0x9ce723;
    memcpy(pvVar5,puVar1,sVar3);
  }
  return;
}

Assistant:

Screenshot(int aspect_width, int aspect_height) {
		// Get the current viewport to establish framebuffer size. Then determine how wide the
		// centre portion of that would be, allowing for the requested aspect ratio.
		GLint dimensions[4];
		glGetIntegerv(GL_VIEWPORT, dimensions);

		height = int(dimensions[3]);
		width = (height * aspect_width) / aspect_height;
		pixel_data.resize(size_t(width * height * 4));

		// Grab the framebuffer contents, temporarily setting single-byte alignment.
		int prior_alignment;
		glGetIntegerv(GL_PACK_ALIGNMENT, &prior_alignment);
		glReadPixels((dimensions[2] - GLint(width)) >> 1, 0, GLint(width), GLint(height), GL_RGBA, GL_UNSIGNED_BYTE, pixel_data.data());
		glPixelStorei(GL_PACK_ALIGNMENT, prior_alignment);

		// Flip the contents into raster order.
		const size_t line_size = size_t(width * 4);
		for(size_t y = 0; y < size_t(height) / 2; ++y) {
			const size_t flipped_y = size_t(height - 1) - y;

			uint8_t temp[line_size];
			memcpy(temp, &pixel_data[flipped_y * line_size], line_size);
			memcpy(&pixel_data[flipped_y * line_size], &pixel_data[y * line_size], line_size);
			memcpy(&pixel_data[y * line_size], temp, line_size);
		}
	}